

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O0

void __thiscall
intel_acbp_v2_t::ibbs_body_t::ibbs_body_t
          (ibbs_body_t *this,kstream *p__io,acbp_element_t *p__parent,intel_acbp_v2_t *p__root)

{
  intel_acbp_v2_t *p__root_local;
  acbp_element_t *p__parent_local;
  kstream *p__io_local;
  ibbs_body_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__ibbs_body_t_0037b600;
  std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>::
  unique_ptr<std::default_delete<intel_acbp_v2_t::hash_t>,void>
            ((unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>> *)
             &this->m_post_ibb_digest);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>>>>>
              *)&this->m_ibb_digests);
  std::unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>>::
  unique_ptr<std::default_delete<intel_acbp_v2_t::hash_t>,void>
            ((unique_ptr<intel_acbp_v2_t::hash_t,std::default_delete<intel_acbp_v2_t::hash_t>> *)
             &this->m_obb_digest);
  std::
  unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->m_reserved2);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>,std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,std::default_delete<intel_acbp_v2_t::ibb_segment_t>>>>>>
              *)&this->m_ibb_segments);
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>::operator=
            (&this->m_post_ibb_digest,(nullptr_t)0x0);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>_>_>_>_>
  ::operator=(&this->m_ibb_digests,(nullptr_t)0x0);
  std::unique_ptr<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>::operator=
            (&this->m_obb_digest,(nullptr_t)0x0);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&this->m_reserved2,(nullptr_t)0x0);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v2_t::ibb_segment_t,_std::default_delete<intel_acbp_v2_t::ibb_segment_t>_>_>_>_>_>
  ::operator=(&this->m_ibb_segments,(nullptr_t)0x0);
  _read(this);
  return;
}

Assistant:

intel_acbp_v2_t::ibbs_body_t::ibbs_body_t(kaitai::kstream* p__io, intel_acbp_v2_t::acbp_element_t* p__parent, intel_acbp_v2_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_post_ibb_digest = nullptr;
    m_ibb_digests = nullptr;
    m_obb_digest = nullptr;
    m_reserved2 = nullptr;
    m_ibb_segments = nullptr;
    _read();
}